

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  code *pcVar3;
  _func_XML_Convert_Result_ENCODING_ptr_char_ptr_ptr_char_ptr_unsigned_short_ptr_ptr_unsigned_short_ptr
  *p_Var4;
  _func_int_ENCODING_ptr_char_ptr_char_ptr_char_ptr *p_Var5;
  SCANNER p_Var6;
  long *plVar7;
  int iVar8;
  XML_Convert_Result XVar9;
  ulong uVar10;
  long lVar11;
  unsigned_short **ppuVar12;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  long lVar13;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  undefined1 *puVar14;
  undefined1 *puVar15;
  long *plVar16;
  undefined8 *puVar17;
  undefined1 *puVar18;
  unsigned_short *in_R8;
  char **ppcVar19;
  char **ppcVar20;
  undefined8 uStack_40;
  undefined1 auStack_38 [8];
  
  puVar15 = auStack_38;
  puVar18 = auStack_38;
  puVar14 = auStack_38;
  uVar10 = (long)end - (long)ptr;
  if ((long)uVar10 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  ppcVar20 = (char **)(ulong)bVar1;
  uStack_40 = 1;
  lVar11 = 1;
  lVar13 = lVar11;
  plVar7 = (long *)auStack_38;
  if (bVar1 == 0x18) goto LAB_0016fec4;
  ppcVar19 = (char **)ptr;
  if (bVar1 == 6) {
    if (uVar10 < 3) {
LAB_0016fe2d:
      *(undefined8 *)(puVar14 + -8) = 0xfffffffffffffffe;
      return (int)*(undefined8 *)(puVar14 + -8);
    }
    uStack_40 = 0x16fe42;
    iVar8 = (*enc[3].literalScanners[1])(enc,ptr,(char *)0x1,ppcVar20);
    if (iVar8 == 0) {
      uStack_40 = 0x16fe57;
      XVar9 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_01,ppcVar20);
      goto LAB_0016ff41;
    }
  }
  else if (bVar1 == 7) {
    puVar14 = auStack_38;
    if (uVar10 < 4) goto LAB_0016fe2d;
    uStack_40 = 0x16fd94;
    iVar8 = (*enc[3].nameMatchesAscii)(enc,ptr,(char *)0x1,(char *)ppcVar20);
    if (iVar8 == 0) {
      uStack_40 = 0x16fda9;
      XVar9 = (*enc[3].scanners[3])(enc,ptr,extraout_RDX_00,ppcVar20);
      goto LAB_0016feb9;
    }
  }
  else if (bVar1 == 0x13) {
    ppcVar19 = (char **)(ptr + 1);
    if ((char **)end == ppcVar19 || (long)end - (long)ppcVar19 < 0) {
      return -1;
    }
    if ((ulong)*(byte *)ppcVar19 == 0x78) {
      ppcVar19 = (char **)(ptr + 2);
      if ((char **)end == ppcVar19 || (long)end - (long)ppcVar19 < 0) {
        return -1;
      }
      if ((*(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar19) & 0xfe) == 0x18) {
        ppcVar19 = (char **)(ptr + 3);
        lVar11 = uVar10 - 3;
        while( true ) {
          if (lVar11 < 1) {
            return -1;
          }
          bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar19);
          if (1 < bVar1 - 0x18) break;
          ppcVar19 = (char **)((long)ppcVar19 + 1);
          lVar11 = lVar11 + -1;
        }
        if (bVar1 == 0x12) {
          ppcVar20 = (char **)((long)ppcVar19 + 1);
          goto LAB_0016feb1;
        }
      }
    }
    else if (*(char *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar19) == '\x19') {
      lVar11 = uVar10 - 2;
      ppcVar20 = (char **)(ptr + 2);
      do {
        ppcVar19 = ppcVar20;
        if (lVar11 < 1) {
          return -1;
        }
        cVar2 = *(char *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar19);
        ppcVar20 = (char **)((long)ppcVar19 + 1);
        lVar11 = lVar11 + -1;
      } while (cVar2 == '\x19');
      if (cVar2 == '\x12') {
LAB_0016feb1:
        puVar17 = &uStack_40;
        uStack_40 = 10;
LAB_0016ff13:
        iVar8 = (int)*puVar17;
        ppcVar19 = ppcVar20;
        goto LAB_0016ffa4;
      }
    }
  }
  else {
    plVar7 = (long *)auStack_38;
    if (bVar1 == 0x16) goto LAB_0016fec4;
    if (bVar1 == 5) {
      puVar14 = auStack_38;
      if (uVar10 == 1) goto LAB_0016fe2d;
      uStack_40 = 0x16fd63;
      iVar8 = (*enc[3].literalScanners[0])(enc,ptr,(char *)0x1,ppcVar20);
      if (iVar8 == 0) {
        uStack_40 = 0x16fd78;
        XVar9 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX,ppcVar20);
        puVar15 = auStack_38;
LAB_0016feb5:
        plVar16 = (long *)(puVar15 + -8);
        *(undefined8 *)(puVar15 + -8) = 2;
        while( true ) {
          lVar13 = *plVar16;
          plVar7 = plVar16 + 1;
          ppcVar19 = (char **)ptr;
          if (XVar9 == XML_CONVERT_COMPLETED) break;
LAB_0016fec4:
          do {
            puVar15 = (undefined1 *)plVar7;
            ptr = (char *)((long)ptr + lVar13);
            uVar10 = (long)end - (long)ptr;
            if ((long)uVar10 < 1) {
              return -1;
            }
            bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
            ppuVar12 = (unsigned_short **)(ulong)bVar1;
            lVar13 = lVar11;
            plVar7 = (long *)puVar15;
          } while (bVar1 - 0x18 < 4);
          puVar14 = puVar15;
          ppcVar19 = (char **)ptr;
          if (bVar1 == 5) {
            if (uVar10 == 1) goto LAB_0016fe2d;
            p_Var6 = enc[3].literalScanners[0];
            *(undefined8 *)(puVar15 + -8) = 0x16ff5f;
            iVar8 = (*p_Var6)(enc,ptr,(char *)0x1,(char **)ppuVar12);
            if (iVar8 != 0) break;
            p_Var4 = enc[2].utf16Convert;
            *(undefined8 *)(puVar15 + -8) = 0x16ff70;
            XVar9 = (*p_Var4)(enc,(char **)ptr,extraout_RDX_02,ppuVar12,in_R8);
            goto LAB_0016feb5;
          }
          if (bVar1 == 6) {
            if (uVar10 < 3) goto LAB_0016fe2d;
            p_Var6 = enc[3].literalScanners[1];
            *(undefined8 *)(puVar15 + -8) = 0x16ff30;
            iVar8 = (*p_Var6)(enc,ptr,(char *)0x1,(char **)ppuVar12);
            if (iVar8 != 0) break;
            pcVar3 = *(code **)&enc[2].minBytesPerChar;
            *(undefined8 *)(puVar15 + -8) = 0x16ff41;
            XVar9 = (*pcVar3)(enc,ptr);
            puVar18 = puVar15;
LAB_0016ff41:
            plVar16 = (long *)(puVar18 + -8);
            *(undefined8 *)(puVar18 + -8) = 3;
          }
          else {
            if (bVar1 != 7) {
              if (bVar1 != 0x16) {
                if (bVar1 != 0x12) break;
                ppcVar20 = (char **)((long)ptr + 1);
                puVar17 = (undefined8 *)(puVar15 + -8);
                *(undefined8 *)(puVar15 + -8) = 9;
                goto LAB_0016ff13;
              }
              goto LAB_0016fec4;
            }
            if (uVar10 < 4) goto LAB_0016fe2d;
            p_Var5 = enc[3].nameMatchesAscii;
            *(undefined8 *)(puVar15 + -8) = 0x16ff8c;
            iVar8 = (*p_Var5)(enc,ptr,(char *)0x1,(char *)ppuVar12);
            if (iVar8 != 0) break;
            p_Var6 = enc[3].scanners[0];
            *(undefined8 *)(puVar15 + -8) = 0x16ff9d;
            XVar9 = (*p_Var6)(enc,ptr,extraout_RDX_03,(char **)ppuVar12);
LAB_0016feb9:
            plVar16 = (long *)(puVar15 + -8);
            *(undefined8 *)(puVar15 + -8) = 4;
          }
        }
      }
    }
  }
  iVar8 = 0;
LAB_0016ffa4:
  *nextTokPtr = (char *)ppcVar19;
  return iVar8;
}

Assistant:

static int PTRCALL
PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}